

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O3

ScalarFunction * duckdb::ListHasAllFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f1;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  code *local_d8;
  LogicalType local_d0 [24];
  LogicalType local_b8 [24];
  LogicalType local_a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  LogicalType local_70 [24];
  LogicalType local_58 [24];
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType(local_d0,ANY);
  duckdb::LogicalType::LIST(local_58);
  duckdb::LogicalType::LogicalType(local_a0,ANY);
  duckdb::LogicalType::LIST(local_40);
  __l._M_len = 2;
  __l._M_array = local_58;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,__l,&local_f1);
  duckdb::LogicalType::LogicalType(local_b8,BOOLEAN);
  local_e8 = 0;
  local_f0 = ListHasAllFunction;
  local_d8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_70,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_70);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,3);
  }
  duckdb::LogicalType::~LogicalType(local_b8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_58 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_a0);
  duckdb::LogicalType::~LogicalType(local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction ListHasAllFun::GetFunction() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LIST(LogicalType::ANY)}, LogicalType::BOOLEAN,
	                   ListHasAllFunction, ListHasAnyOrAllBind);
	return fun;
}